

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

void __thiscall
Assimp::Discreet3DSImporter::ParseColorChunk
          (Discreet3DSImporter *this,aiColor3D *out,bool acceptPercent)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  ai_real _r;
  float fVar4;
  ai_real invVal;
  undefined1 uStack_32;
  bool bGamma;
  uint diff;
  Chunk chunk;
  ai_real qnan;
  bool acceptPercent_local;
  aiColor3D *out_local;
  Discreet3DSImporter *this_local;
  
  if (out == (aiColor3D *)0x0) {
    __assert_fail("out != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/3DS/3DSLoader.cpp"
                  ,0x552,"void Assimp::Discreet3DSImporter::ParseColorChunk(aiColor3D *, bool)");
  }
  _r = get_qnan();
  if ((ParseColorChunk(aiColor3D*,bool)::clrError == '\0') &&
     (iVar2 = __cxa_guard_acquire(&ParseColorChunk(aiColor3D*,bool)::clrError), iVar2 != 0)) {
    aiColor3D::aiColor3D(&ParseColorChunk::clrError,_r,_r,_r);
    __cxa_guard_release(&ParseColorChunk(aiColor3D*,bool)::clrError);
  }
  ReadChunk(this,(Chunk *)&uStack_32);
  uVar3 = diff - 6;
  switch(_uStack_32) {
  case 0x12:
  case 0x11:
    if (uVar3 < 3) {
      aiColor3D::operator=(out,&ParseColorChunk::clrError);
    }
    else {
      bVar1 = StreamReader<false,_false>::GetI1(this->stream);
      out->r = (float)bVar1 * 0.003921569;
      bVar1 = StreamReader<false,_false>::GetI1(this->stream);
      out->g = (float)bVar1 * 0.003921569;
      bVar1 = StreamReader<false,_false>::GetI1(this->stream);
      out->b = (float)bVar1 * 0.003921569;
    }
    break;
  case 0x13:
  case 0x10:
    if (uVar3 < 0xc) {
      aiColor3D::operator=(out,&ParseColorChunk::clrError);
    }
    else {
      fVar4 = StreamReader<false,_false>::GetF4(this->stream);
      out->r = fVar4;
      fVar4 = StreamReader<false,_false>::GetF4(this->stream);
      out->g = fVar4;
      fVar4 = StreamReader<false,_false>::GetF4(this->stream);
      out->b = fVar4;
    }
    break;
  default:
    StreamReader<false,_false>::IncPtr(this->stream,(ulong)uVar3);
    ParseColorChunk(this,out,acceptPercent);
    break;
  case 0x30:
    if ((acceptPercent) && (uVar3 != 0)) {
      bVar1 = StreamReader<false,_false>::GetI1(this->stream);
      fVar4 = (float)bVar1 / 255.0;
      out->r = fVar4;
      out->b = fVar4;
      out->g = fVar4;
    }
    else {
      aiColor3D::operator=(out,&ParseColorChunk::clrError);
    }
    break;
  case 0x31:
    if ((acceptPercent) && (3 < uVar3)) {
      fVar4 = StreamReader<false,_false>::GetF4(this->stream);
      out->r = fVar4;
      out->b = fVar4;
      out->g = fVar4;
    }
    else {
      aiColor3D::operator=(out,&ParseColorChunk::clrError);
    }
  }
  return;
}

Assistant:

void Discreet3DSImporter::ParseColorChunk( aiColor3D* out, bool acceptPercent )
{
    ai_assert(out != NULL);

    // error return value
    const ai_real qnan = get_qnan();
    static const aiColor3D clrError = aiColor3D(qnan,qnan,qnan);

    Discreet3DS::Chunk chunk;
    ReadChunk(&chunk);
    const unsigned int diff = chunk.Size - sizeof(Discreet3DS::Chunk);

    bool bGamma = false;

    // Get the type of the chunk
    switch(chunk.Flag)
    {
    case Discreet3DS::CHUNK_LINRGBF:
        bGamma = true;

    case Discreet3DS::CHUNK_RGBF:
        if (sizeof(float) * 3 > diff)   {
            *out = clrError;
            return;
        }
        out->r = stream->GetF4();
        out->g = stream->GetF4();
        out->b = stream->GetF4();
        break;

    case Discreet3DS::CHUNK_LINRGBB:
        bGamma = true;
    case Discreet3DS::CHUNK_RGBB:
        {
            if ( sizeof( char ) * 3 > diff ) {
                *out = clrError;
                return;
            }
            const ai_real invVal = ai_real( 1.0 ) / ai_real( 255.0 );
            out->r = ( ai_real ) ( uint8_t ) stream->GetI1() * invVal;
            out->g = ( ai_real ) ( uint8_t ) stream->GetI1() * invVal;
            out->b = ( ai_real ) ( uint8_t ) stream->GetI1() * invVal;
        }
        break;

    // Percentage chunks are accepted, too.
    case Discreet3DS::CHUNK_PERCENTF:
        if (acceptPercent && 4 <= diff) {
            out->g = out->b = out->r = stream->GetF4();
            break;
        }
        *out = clrError;
        return;

    case Discreet3DS::CHUNK_PERCENTW:
        if (acceptPercent && 1 <= diff) {
            out->g = out->b = out->r = (ai_real)(uint8_t)stream->GetI1() / ai_real( 255.0 );
            break;
        }
        *out = clrError;
        return;

    default:
        stream->IncPtr(diff);
        // Skip unknown chunks, hope this won't cause any problems.
        return ParseColorChunk(out,acceptPercent);
    };
    (void)bGamma;
}